

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool IsBIP30Unspendable(CBlockIndex *block_index)

{
  uint256 *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  uchar uVar3;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 auVar4 [16];
  uchar uVar20;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  undefined1 auVar21 [16];
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  undefined8 local_38;
  undefined2 uStack_30;
  uchar uStack_2e;
  
  if (block_index->nHeight == 0x166a4) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_0040859c:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar3 = (puVar1->super_base_blob<256U>).m_data._M_elems[0];
    uVar5 = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
    uVar6 = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
    uVar7 = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
    uVar8 = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
    uVar9 = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
    uVar10 = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
    uVar11 = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
    uVar12 = (puVar1->super_base_blob<256U>).m_data._M_elems[8];
    uVar13 = (puVar1->super_base_blob<256U>).m_data._M_elems[9];
    uVar14 = (puVar1->super_base_blob<256U>).m_data._M_elems[10];
    uVar15 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
    uVar16 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
    uVar17 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
    uVar18 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
    uVar19 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
    uVar20 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
    uVar22 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
    uVar23 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
    uVar24 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
    uVar25 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
    uVar26 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
    uVar27 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
    uVar28 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
    uVar29 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
    uVar30 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
    uVar31 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
    uVar32 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
    uVar33 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
    uVar34 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
    uVar35 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
    uVar36 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
    uVar37 = '/';
    uVar38 = 'o';
    uVar39 = '0';
    uVar40 = 0xf9;
    uVar41 = 0xd6;
    uVar42 = 0x83;
    uVar43 = 0xde;
    uVar44 = 0xb8;
    uVar45 = ']';
    uVar46 = 0x93;
    uVar47 = '\x14';
    uVar48 = 0xef;
    uVar49 = ']';
    uVar50 = 0xcf;
    uVar51 = '6';
    uVar52 = 0xaf;
    local_38 = 0xd4792b1acee3d966;
    uStack_30 = 0xf0ae;
    uStack_2e = '\n';
  }
  else {
    if (block_index->nHeight != 0x1664a) {
      bVar2 = false;
      goto LAB_00408582;
    }
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_0040859c;
    uVar3 = (puVar1->super_base_blob<256U>).m_data._M_elems[0];
    uVar5 = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
    uVar6 = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
    uVar7 = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
    uVar8 = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
    uVar9 = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
    uVar10 = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
    uVar11 = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
    uVar12 = (puVar1->super_base_blob<256U>).m_data._M_elems[8];
    uVar13 = (puVar1->super_base_blob<256U>).m_data._M_elems[9];
    uVar14 = (puVar1->super_base_blob<256U>).m_data._M_elems[10];
    uVar15 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
    uVar16 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
    uVar17 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
    uVar18 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
    uVar19 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
    uVar20 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
    uVar22 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
    uVar23 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
    uVar24 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
    uVar25 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
    uVar26 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
    uVar27 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
    uVar28 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
    uVar29 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
    uVar30 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
    uVar31 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
    uVar32 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
    uVar33 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
    uVar34 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
    uVar35 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
    uVar36 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
    uVar37 = 0x8e;
    uVar38 = 0xd0;
    uVar39 = 'M';
    uVar40 = 'W';
    uVar41 = 0xf2;
    uVar42 = 0xf3;
    uVar43 = 0xcd;
    uVar44 = 0xc6;
    uVar45 = 0xa6;
    uVar46 = 0xe5;
    uVar47 = 'U';
    uVar48 = 'i';
    uVar49 = 0xdc;
    uVar50 = '\x16';
    uVar51 = 'T';
    uVar52 = 0xe1;
    local_38 = 0xdc26e7667f8419f2;
    uStack_30 = 0x71a2;
    uStack_2e = '\x02';
  }
  auVar4[0] = -(uVar3 == uVar37);
  auVar4[1] = -(uVar5 == uVar38);
  auVar4[2] = -(uVar6 == uVar39);
  auVar4[3] = -(uVar7 == uVar40);
  auVar4[4] = -(uVar8 == uVar41);
  auVar4[5] = -(uVar9 == uVar42);
  auVar4[6] = -(uVar10 == uVar43);
  auVar4[7] = -(uVar11 == uVar44);
  auVar4[8] = -(uVar12 == uVar45);
  auVar4[9] = -(uVar13 == uVar46);
  auVar4[10] = -(uVar14 == uVar47);
  auVar4[0xb] = -(uVar15 == uVar48);
  auVar4[0xc] = -(uVar16 == uVar49);
  auVar4[0xd] = -(uVar17 == uVar50);
  auVar4[0xe] = -(uVar18 == uVar51);
  auVar4[0xf] = -(uVar19 == uVar52);
  auVar21[0] = -(uVar20 == (uchar)local_38);
  auVar21[1] = -(uVar22 == local_38._1_1_);
  auVar21[2] = -(uVar23 == local_38._2_1_);
  auVar21[3] = -(uVar24 == local_38._3_1_);
  auVar21[4] = -(uVar25 == local_38._4_1_);
  auVar21[5] = -(uVar26 == local_38._5_1_);
  auVar21[6] = -(uVar27 == local_38._6_1_);
  auVar21[7] = -(uVar28 == local_38._7_1_);
  auVar21[8] = -(uVar29 == (uchar)uStack_30);
  auVar21[9] = -(uVar30 == uStack_30._1_1_);
  auVar21[10] = -(uVar31 == uStack_2e);
  auVar21[0xb] = -(uVar32 == '\0');
  auVar21[0xc] = -(uVar33 == '\0');
  auVar21[0xd] = -(uVar34 == '\0');
  auVar21[0xe] = -(uVar35 == '\0');
  auVar21[0xf] = -(uVar36 == '\0');
  auVar21 = auVar21 & auVar4;
  bVar2 = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff;
LAB_00408582:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Unspendable(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91722 && block_index.GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
           (block_index.nHeight==91812 && block_index.GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"});
}